

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

void __thiscall duckdb::BatchedBufferedData::CompleteBatch(BatchedBufferedData *this,idx_t batch)

{
  mutex *__mutex;
  iterator iVar1;
  idx_t local_20;
  
  __mutex = &(this->super_BufferedData).glock;
  local_20 = batch;
  ::std::mutex::lock(__mutex);
  iVar1 = ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::InProgressBatch>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
          ::find(&(this->buffer)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->buffer)._M_t._M_impl.super__Rb_tree_header) {
    *(undefined1 *)&iVar1._M_node[3]._M_right = 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void BatchedBufferedData::CompleteBatch(idx_t batch) {
	lock_guard<mutex> lock(glock);
	auto it = buffer.find(batch);
	if (it == buffer.end()) {
		return;
	}

	auto &in_progress_batch = it->second;
	in_progress_batch.completed = true;
}